

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O1

String16 * helper::to_utf16(String16 *__return_storage_ptr__,String8 *str)

{
  char *__first;
  range_error error;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  converter;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  local_78;
  
  local_78._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
                  )operator_new(0x20);
  *(undefined4 *)
   ((long)local_78._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 8) = 0;
  *(char **)((long)local_78._M_cvt._M_t.
                   super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
                   .
                   super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
                   ._M_head_impl + 0x10) =
       "igel13IMC_Generator23generateUnaryROperationENS0_13OperationTypeENS_5HexOpESt10shared_ptrINS_11IM_OperatorEES3_INS_5TokenEE"
  ;
  *(undefined4 *)
   ((long)local_78._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined ***)
   local_78._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .super__Head_base<0UL,_std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>.
   _M_head_impl = &PTR____codecvt_utf8_base_0018a758;
  local_78._M_byte_err_string._M_dataplus._M_p = (pointer)&local_78._M_byte_err_string.field_2;
  local_78._M_byte_err_string._M_string_length = 0;
  local_78._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_78._M_wide_err_string._M_dataplus._M_p = (pointer)&local_78._M_wide_err_string.field_2;
  local_78._M_wide_err_string._M_string_length = 0;
  local_78._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_78._M_state.__count = 0;
  local_78._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_78._M_count = 0;
  local_78._M_with_cvtstate = false;
  local_78._M_with_strings = false;
  __first = (str->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&local_78,__first,__first + str->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_78);
  return __return_storage_ptr__;
}

Assistant:

String16 to_utf16( const String8 &str )
		{
			std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> converter;
			try
			{
				return converter.from_bytes( str );
			}
			catch( std::range_error error )
			{
				log( "Conversation failure 'to_utf16(const String8 &)'. Message: " + String8( error.what() ), LogLevel::Warning );
				return u"";
			}
		}